

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aems.cpp
# Opt level: O2

void despot::AEMS::Update(QNode *qnode)

{
  double dVar1;
  VNode *this;
  map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
  *pmVar2;
  _Base_ptr p_Var3;
  _Self __tmp;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double local_68;
  double dStack_60;
  
  local_68 = qnode->step_reward;
  pmVar2 = QNode::children(qnode);
  dStack_60 = local_68;
  for (p_Var3 = (pmVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left; dVar6 = DAT_0019fdd8
      , (_Rb_tree_header *)p_Var3 != &(pmVar2->_M_t)._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    this = (VNode *)p_Var3[1]._M_parent;
    dVar1 = this->likelihood;
    dVar4 = VNode::lower_bound(this);
    dVar7 = this->likelihood * DAT_0019fdd8;
    dVar5 = VNode::upper_bound(this);
    local_68 = local_68 + dVar5 * dVar7;
    dStack_60 = dStack_60 + dVar4 * dVar1 * dVar6;
  }
  dVar6 = QNode::lower_bound(qnode);
  if (dVar6 < dStack_60) {
    QNode::lower_bound(qnode,dStack_60);
  }
  dVar6 = QNode::upper_bound(qnode);
  if (local_68 < dVar6) {
    QNode::upper_bound(qnode,local_68);
    return;
  }
  return;
}

Assistant:

void AEMS::Update(QNode* qnode) {
	double lower = qnode->step_reward;
	double upper = qnode->step_reward;

	map<OBS_TYPE, VNode*>& children = qnode->children();
	for (map<OBS_TYPE, VNode*>::iterator it = children.begin();
			it != children.end(); it++) {
		VNode* vnode = it->second;

		lower += Globals::Discount() * vnode->likelihood * vnode->lower_bound();
		upper += Globals::Discount() * vnode->likelihood * vnode->upper_bound();
	}

	if (lower > qnode->lower_bound())
		qnode->lower_bound(lower);
	if (upper < qnode->upper_bound())
		qnode->upper_bound(upper);
}